

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char **ppcVar6;
  ATTRIBUTE *pAVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char **ppcStack_40;
  
  uVar4 = (long)end - (long)ptr;
  if ((long)uVar4 < 1) {
    return -1;
  }
  cVar1 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  ppcStack_40 = (char **)&DAT_00000001;
  switch(cVar1) {
  case '\x05':
    if (uVar4 == 1) {
      return -2;
    }
    ppcVar6 = (char **)&DAT_00000001;
    iVar3 = (*enc[3].nameLength)(enc,ptr);
    if ((iVar3 == 0) &&
       (iVar3 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX,ppcVar6), iVar3 != 0)) {
      ppcStack_40 = (char **)0x2;
      goto switchD_005a6ecc_caseD_16;
    }
    break;
  case '\x06':
    if (uVar4 < 3) {
      return -2;
    }
    ppcVar6 = (char **)&DAT_00000001;
    pcVar5 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar5 == 0) {
      iVar3 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX_01,ppcVar6);
      ppcStack_40 = (char **)0x3;
LAB_005a6f79:
      if (iVar3 != 0) {
switchD_005a6ecc_caseD_16:
        ptr = ptr + (long)ppcStack_40;
        do {
          uVar4 = (long)end - (long)ptr;
          if ((long)uVar4 < 1) {
            return -1;
          }
          bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
          pAVar7 = (ATTRIBUTE *)(ulong)bVar2;
          ppcStack_40 = (char **)&DAT_00000001;
          if (3 < bVar2 - 0x18) {
            if (bVar2 == 5) {
              if (uVar4 == 1) {
                return -2;
              }
              iVar3 = (*enc[3].nameLength)(enc,ptr);
              if (iVar3 != 0) break;
              iVar3 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_02,&pAVar7->name);
              ppcStack_40 = (char **)0x2;
            }
            else if (bVar2 == 6) {
              if (uVar4 < 3) {
                return -2;
              }
              pcVar5 = (*enc[3].skipS)(enc,ptr);
              if ((int)pcVar5 != 0) break;
              iVar3 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_04,&pAVar7->name);
              ppcStack_40 = (char **)0x3;
            }
            else {
              if (bVar2 != 7) {
                if (bVar2 == 0x16) goto LAB_005a7061;
                if (bVar2 != 0x12) break;
                ptr = (char *)((byte *)ptr + 1);
                iVar3 = 0x1c;
                goto LAB_005a707a;
              }
              if (uVar4 < 4) {
                return -2;
              }
              iVar3 = (*enc[3].getAtts)(enc,ptr,1,pAVar7);
              if (iVar3 != 0) break;
              iVar3 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_03,&pAVar7->name);
              ppcStack_40 = (char **)0x4;
            }
            if (iVar3 == 0) break;
          }
LAB_005a7061:
          ptr = (char *)((byte *)ptr + (long)ppcStack_40);
        } while( true );
      }
    }
    break;
  case '\a':
    if (uVar4 < 4) {
      return -2;
    }
    ppcVar6 = (char **)&DAT_00000001;
    iVar3 = (*enc[3].getAtts)(enc,ptr,0x790120,(ATTRIBUTE *)&DAT_00000001);
    if (iVar3 == 0) {
      iVar3 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX_00,(char *)ppcVar6);
      ppcStack_40 = (char **)0x4;
      goto LAB_005a6f79;
    }
    break;
  case '\b':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x14':
  case '\x17':
    break;
  case '\t':
  case '\n':
  case '\x15':
switchD_005a6ecc_caseD_9:
    iVar3 = 0x16;
    goto LAB_005a707a;
  case '\x16':
  case '\x18':
    goto switchD_005a6ecc_caseD_16;
  default:
    if (cVar1 == '\x1e') goto switchD_005a6ecc_caseD_9;
  }
  iVar3 = 0;
LAB_005a707a:
  *nextTokPtr = ptr;
  return iVar3;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S:
  case BT_LF:
  case BT_CR:
  case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}